

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Handler.cpp
# Opt level: O1

uint16_t __thiscall Handler::Purchase(Handler *this,VirtualMachine *vm)

{
  char *pcVar1;
  undefined2 uVar2;
  undefined2 uVar3;
  undefined4 uVar4;
  byte bVar5;
  pointer pRVar6;
  pointer pDVar7;
  pointer pPVar8;
  pointer pMVar9;
  pointer pRVar10;
  pointer pSVar11;
  undefined8 in_RAX;
  DeployedVirtualMachine *deployedVM;
  PurchasedServer *__args;
  pointer pDVar12;
  pointer pPVar13;
  pointer pMVar14;
  pointer pRVar15;
  uint uVar16;
  uint16_t *puVar17;
  PurchasedServer *item;
  pointer pPVar18;
  ushort uVar19;
  int iVar20;
  char *pcVar21;
  char *pcVar22;
  ulong uVar23;
  ulong uVar24;
  ushort uVar25;
  short sVar26;
  bool bVar27;
  undefined1 auVar28 [16];
  uint8_t serverIdx;
  undefined8 uStack_28;
  
  bVar5 = this->N;
  uStack_28._4_4_ = (undefined4)((ulong)in_RAX >> 0x20);
  uStack_28._0_3_ = (undefined3)in_RAX;
  uStack_28._0_4_ = CONCAT13(bVar5 - 1,(undefined3)uStack_28);
  if (bVar5 != 0) {
    puVar17 = &((this->servers).super__Vector_base<Server,_std::allocator<Server>_>._M_impl.
                super__Vector_impl_data._M_start)->memorySize;
    uVar23 = 0;
    do {
      if (vm->nodeType == false) {
        if (vm->cpuCore <= puVar17[-1] >> 1) {
          uVar25 = *puVar17 >> 1;
          goto LAB_0010a914;
        }
      }
      else if (vm->cpuCore <= puVar17[-1]) {
        uVar25 = *puVar17;
LAB_0010a914:
        if (vm->memorySize <= uVar25) {
          uStack_28._0_4_ = CONCAT13((char)uVar23,(undefined3)uStack_28);
          break;
        }
      }
      uVar23 = uVar23 + 1;
      puVar17 = puVar17 + 0x1c;
    } while (bVar5 != uVar23);
  }
  __args = (PurchasedServer *)operator_new(0x48);
  (__args->deployedVM)._M_h._M_buckets = (__buckets_ptr)0x0;
  (__args->deployedVM)._M_h._M_bucket_count = 0;
  *(undefined8 *)&(__args->deployedVM)._M_h._M_rehash_policy = 0;
  (__args->deployedVM)._M_h._M_rehash_policy._M_next_resize = 0;
  __args->id = 0;
  __args->serverIdx = '\0';
  __args->vacancyRate = '\0';
  __args->remainCpuCoreA = 0;
  __args->remainCpuCoreB = 0;
  __args->remainMemorySizeA = 0;
  __args->remainMemorySizeB = 0;
  *(undefined4 *)&__args->field_0xc = 0;
  (__args->deployedVM)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__args->deployedVM)._M_h._M_element_count = 0;
  (__args->deployedVM)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (__args->deployedVM)._M_h._M_buckets = &(__args->deployedVM)._M_h._M_single_bucket;
  (__args->deployedVM)._M_h._M_bucket_count = 1;
  (__args->deployedVM)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (__args->deployedVM)._M_h._M_rehash_policy._M_next_resize = 0;
  (__args->deployedVM)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  uVar25 = this->today;
  pRVar6 = (this->result).super__Vector_base<Result,_std::allocator<Result>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar19 = this->totalPurchasedServerNum;
  pcVar22 = *(char **)&pRVar6[uVar25].extendResult.
                       super__Vector_base<ExtendResult,_std::allocator<ExtendResult>_>._M_impl;
  uVar16 = (uint)((ulong)((long)*(pointer *)
                                 ((long)&pRVar6[uVar25].extendResult.
                                         super__Vector_base<ExtendResult,_std::allocator<ExtendResult>_>
                                         ._M_impl + 8) - (long)pcVar22) >> 2);
  bVar27 = 0 < (int)uVar16;
  if ((int)uVar16 < 1) {
LAB_0010aa07:
    iVar20 = 0;
  }
  else {
    sVar26 = *(short *)(pcVar22 + 2);
    uVar19 = uVar19 + sVar26;
    if (*pcVar22 == uStack_28._3_1_) {
      uVar23 = 0;
    }
    else {
      uVar24 = (ulong)(uVar16 & 0x7fffffff);
      uVar23 = 0;
      pcVar21 = pcVar22;
      do {
        if (uVar24 - 1 == uVar23) {
          bVar27 = uVar23 + 1 < uVar24;
          goto LAB_0010aa07;
        }
        pcVar22 = pcVar21 + 4;
        sVar26 = *(short *)(pcVar21 + 6);
        uVar19 = uVar19 + sVar26;
        uVar23 = uVar23 + 1;
        pcVar1 = pcVar21 + 4;
        pcVar21 = pcVar22;
      } while (*pcVar1 != uStack_28._3_1_);
      bVar27 = uVar23 < uVar24;
    }
    iVar20 = (int)uVar23;
    *(short *)(pcVar22 + 2) = sVar26 + 1;
  }
  pRVar6 = pRVar6 + uVar25;
  if (bVar27) {
    if (iVar20 < (int)(uVar16 - 1)) {
      pDVar7 = (this->deployedVMs).
               super__Vector_base<DeployedVirtualMachine,_std::allocator<DeployedVirtualMachine>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      for (pDVar12 = (this->deployedVMs).
                     super__Vector_base<DeployedVirtualMachine,_std::allocator<DeployedVirtualMachine>_>
                     ._M_impl.super__Vector_impl_data._M_start; pDVar12 != pDVar7;
          pDVar12 = pDVar12 + 1) {
        if (uVar19 <= pDVar12->purchasedServerId) {
          pDVar12->purchasedServerId = pDVar12->purchasedServerId + 1;
        }
      }
      pPVar8 = (this->purchasedServers).
               super__Vector_base<PurchasedServer,_std::allocator<PurchasedServer>_>._M_impl.
               super__Vector_impl_data._M_finish;
      pPVar13 = (this->purchasedServers).
                super__Vector_base<PurchasedServer,_std::allocator<PurchasedServer>_>._M_impl.
                super__Vector_impl_data._M_start;
      for (pPVar18 = pPVar13; pPVar18 != pPVar8; pPVar18 = pPVar18 + 1) {
        if (uVar19 <= pPVar18->id) {
          pPVar18->id = pPVar18->id + 1;
        }
      }
      uVar16 = ((uint)(*(int *)&(this->purchasedServers).
                                super__Vector_base<PurchasedServer,_std::allocator<PurchasedServer>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (int)pPVar13) >> 3) *
               0x38e38e39 & 0xffff;
      if (uVar16 != 0) {
        uVar23 = 0;
        do {
          this->purchasedServerIdxMap[pPVar13->id] = (uint16_t)uVar23;
          uVar23 = uVar23 + 1;
          pPVar13 = pPVar13 + 1;
        } while (uVar16 != uVar23);
      }
      pMVar9 = *(pointer *)
                ((long)&(pRVar6->migrateResult).
                        super__Vector_base<MigrateResult,_std::allocator<MigrateResult>_>._M_impl +
                8);
      for (pMVar14 = *(pointer *)
                      &(pRVar6->migrateResult).
                       super__Vector_base<MigrateResult,_std::allocator<MigrateResult>_>._M_impl;
          pMVar14 != pMVar9; pMVar14 = pMVar14 + 1) {
        if (uVar19 <= pMVar14->purchasedServerId) {
          pMVar14->purchasedServerId = pMVar14->purchasedServerId + 1;
        }
      }
      pRVar10 = *(pointer *)
                 ((long)&(pRVar6->requestResult).
                         super__Vector_base<RequestResult,_std::allocator<RequestResult>_>._M_impl +
                 8);
      for (pRVar15 = *(pointer *)
                      &(pRVar6->requestResult).
                       super__Vector_base<RequestResult,_std::allocator<RequestResult>_>._M_impl;
          pRVar15 != pRVar10; pRVar15 = pRVar15 + 1) {
        if (uVar19 <= pRVar15->purchasedServerId) {
          pRVar15->purchasedServerId = pRVar15->purchasedServerId + 1;
        }
      }
    }
  }
  else {
    uStack_28 = CONCAT44(1,(undefined4)uStack_28);
    std::vector<ExtendResult,std::allocator<ExtendResult>>::
    emplace_back<unsigned_char&,unsigned_int>
              ((vector<ExtendResult,std::allocator<ExtendResult>> *)pRVar6,
               (uchar *)((long)&uStack_28 + 3),(uint *)((long)&uStack_28 + 4));
  }
  __args->id = uVar19;
  __args->serverIdx = uStack_28._3_1_;
  pSVar11 = (this->servers).super__Vector_base<Server,_std::allocator<Server>_>._M_impl.
            super__Vector_impl_data._M_start + uStack_28._3_1_;
  uVar2 = pSVar11->cpuCore;
  uVar3 = pSVar11->memorySize;
  uVar4 = pSVar11->hardwareCost;
  auVar28._4_4_ = uVar4;
  auVar28._2_2_ = uVar3;
  auVar28._0_2_ = uVar2;
  auVar28._8_8_ = 0;
  auVar28 = pshuflw(auVar28,auVar28,0x50);
  __args->remainCpuCoreA = auVar28._0_2_ >> 1;
  __args->remainCpuCoreB = auVar28._2_2_ >> 1;
  __args->remainMemorySizeA = auVar28._4_2_ >> 1;
  __args->remainMemorySizeB = auVar28._6_2_ >> 1;
  this->purchasedServerIdxMap[uVar19] =
       (short)((uint)(*(int *)&(this->purchasedServers).
                               super__Vector_base<PurchasedServer,_std::allocator<PurchasedServer>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                     *(int *)&(this->purchasedServers).
                              super__Vector_base<PurchasedServer,_std::allocator<PurchasedServer>_>.
                              _M_impl.super__Vector_impl_data._M_start) >> 3) * -0x71c7;
  std::vector<PurchasedServer,std::allocator<PurchasedServer>>::emplace_back<PurchasedServer&>
            ((vector<PurchasedServer,std::allocator<PurchasedServer>> *)&this->purchasedServers,
             __args);
  this->totalHardwareCost =
       this->totalHardwareCost +
       (ulong)(this->servers).super__Vector_base<Server,_std::allocator<Server>_>._M_impl.
              super__Vector_impl_data._M_start[uStack_28 >> 0x18 & 0xff].hardwareCost;
  return this->purchasedServerIdxMap[uVar19];
}

Assistant:

uint16_t Handler::Purchase(const VirtualMachine &vm) {
    uint8_t serverIdx = N - 1u;
    for (uint8_t i = 0u; i < N; ++i) {
        Server &server = servers[i];
        if (CheckCapacity(server, vm)) {
            serverIdx = i;
            break;
        }
    }

    auto *purchasedServer = new PurchasedServer();
    std::vector<ExtendResult> &extendResult = result[today].extendResult;
    uint16_t id = totalPurchasedServerNum;
    int resultIdx = 0, n = (int) extendResult.size();
    bool exist = false;
    for (int i = 0; i < n; ++i) {
        id += extendResult[i].purchaseNum;
        if (extendResult[i].serverIdx == serverIdx) {   // 买过同一型号的 server
            ++extendResult[i].purchaseNum;   // 数量加一表示多买一个
            exist = true;
            resultIdx = i;
            break;
        }
    }

    // 已经购买过这一类型的服务器
    if (exist) {
        if (resultIdx < n - 1) {  // 不是 extendResult 中的最后一个种类
            for (DeployedVirtualMachine &deployedVM : deployedVMs) {
                if (deployedVM.purchasedServerId >= id) ++deployedVM.purchasedServerId;
            }
            for (PurchasedServer &item : purchasedServers) {
                if (item.id >= id) ++item.id;
            }
            ReMapPurchasedServerIdx();

            std::vector<MigrateResult> &migrateResult = result[today].migrateResult;
            for (MigrateResult &res : migrateResult) {
                if (res.purchasedServerId >= id) ++res.purchasedServerId;
            }
            std::vector<RequestResult> &requestResult = result[today].requestResult;
            for (RequestResult &res : requestResult) {
                if (res.purchasedServerId >= id) ++res.purchasedServerId;
            }
        }
    } else {
        extendResult.emplace_back(serverIdx, 1u);
    }

    purchasedServer->id = id;
    purchasedServer->serverIdx = serverIdx;
    purchasedServer->remainCpuCoreA = (servers[serverIdx].cpuCore >> 1u);
    purchasedServer->remainCpuCoreB = (servers[serverIdx].cpuCore >> 1u);
    purchasedServer->remainMemorySizeA = (servers[serverIdx].memorySize >> 1u);
    purchasedServer->remainMemorySizeB = (servers[serverIdx].memorySize >> 1u);
    purchasedServerIdxMap[id] = purchasedServers.size();
    purchasedServers.emplace_back(*purchasedServer);

#ifdef TEST
    totalHardwareCost += servers[serverIdx].hardwareCost;
#endif

    return purchasedServerIdxMap[id];
}